

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_codePointAt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  JSValue JVar2;
  int iVar3;
  uint uVar4;
  JSValueUnion p;
  int64_t iVar5;
  JSValueUnion JVar6;
  uint uVar7;
  JSRefCountHeader *p_1;
  JSValue v;
  int idx;
  uint local_2c;
  
  v = JS_ToStringCheckObject(ctx,this_val);
  p = v.u;
  uVar7 = (uint)v.tag;
  JVar1 = v;
  if (uVar7 != 6) {
    JVar1 = *argv;
    if (0xfffffff4 < (uint)argv->tag) {
      *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
    }
    iVar3 = JS_ToInt32SatFree(ctx,(int *)&local_2c,JVar1);
    if (iVar3 == 0) {
      iVar5 = 3;
      if (((int)local_2c < 0) || ((*(uint *)((long)p.ptr + 4) & 0x7fffffff) <= local_2c)) {
        JVar6.float64 = 0.0;
      }
      else {
        uVar4 = string_getc((JSString *)p.ptr,(int *)&local_2c);
        JVar6._4_4_ = 0;
        JVar6.int32 = uVar4;
        iVar5 = 0;
      }
      JVar1.tag = iVar5;
      JVar1.u.ptr = JVar6.ptr;
      JVar2.tag = iVar5;
      JVar2.u.ptr = JVar6.ptr;
      if (uVar7 < 0xfffffff5) {
        return JVar2;
      }
      iVar3 = *p.ptr;
      *(int *)p.ptr = iVar3 + -1;
    }
    else {
      if (uVar7 < 0xfffffff5) {
        return (JSValue)(ZEXT816(6) << 0x40);
      }
      iVar3 = *p.ptr;
      *(int *)p.ptr = iVar3 + -1;
      iVar5 = 6;
      JVar6.float64 = 0.0;
      JVar1 = (JSValue)(ZEXT816(6) << 0x40);
    }
    if (iVar3 < 2) {
      JVar1.tag = iVar5;
      JVar1.u.ptr = JVar6.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
  }
  return JVar1;
}

Assistant:

static JSValue js_string_codePointAt(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue val, ret;
    JSString *p;
    int idx, c;

    val = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_STRING(val);
    if (JS_ToInt32Sat(ctx, &idx, argv[0])) {
        JS_FreeValue(ctx, val);
        return JS_EXCEPTION;
    }
    if (idx < 0 || idx >= p->len) {
        ret = JS_UNDEFINED;
    } else {
        c = string_getc(p, &idx);
        ret = JS_NewInt32(ctx, c);
    }
    JS_FreeValue(ctx, val);
    return ret;
}